

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLexer.cpp
# Opt level: O0

JsonLexer * __thiscall json::JsonLexer::readExponent_abi_cxx11_(JsonLexer *this,istream *input)

{
  byte bVar1;
  int iVar2;
  long *plVar3;
  runtime_error *prVar4;
  JsonLexer local_50 [54];
  char local_1a;
  undefined1 local_19;
  char c;
  istream *piStack_18;
  istream *input_local;
  string *exponent;
  
  local_19 = 0;
  piStack_18 = input;
  input_local = (istream *)this;
  std::__cxx11::string::string((string *)this);
  std::istream::get((char *)piStack_18);
  std::__cxx11::string::operator+=((string *)this,local_1a);
  plVar3 = (long *)std::istream::get((char *)piStack_18);
  bVar1 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  if ((bVar1 & 1) != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"A number cannot end with \'e\' or \'E\'");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_1a == '-') || (local_1a == '+')) {
    std::__cxx11::string::operator+=((string *)this,local_1a);
    plVar3 = (long *)std::istream::get((char *)piStack_18);
    bVar1 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (((bVar1 & 1) != 0) || (iVar2 = isdigit((int)local_1a), iVar2 == 0)) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,"After a minus or plus sign there must be at least one digit");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  iVar2 = isdigit((int)local_1a);
  if (iVar2 == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"A valid exponent requires at least one digit");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator+=((string *)this,local_1a);
  readDigits_abi_cxx11_(local_50,piStack_18);
  std::__cxx11::string::operator+=((string *)this,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  return this;
}

Assistant:

std::string JsonLexer::readExponent(std::istream &input)
    {
        std::string exponent;
        char c;
        input.get(c);

        exponent += c; // We append 'e' or 'E'.

        if (!input.get(c))
            throw std::runtime_error("A number cannot end with 'e' or 'E'");

        if (c == '-' || c == '+')
        {
            exponent += c;
            if (!(input.get(c)) || !isdigit(c))
                throw std::runtime_error("After a minus or plus sign there must be at least one digit");
        }

        if (!isdigit(c))
            throw std::runtime_error("A valid exponent requires at least one digit");

        exponent += c;
        exponent += readDigits(input);
        return exponent;
    }